

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::MultiSelectItemFooter(ImGuiID id,bool *p_selected,bool *p_pressed)

{
  float *pfVar1;
  ImRect *pIVar2;
  float fVar3;
  float fVar4;
  ImS8 IVar5;
  uint uVar6;
  ImGuiWindow *window;
  ImGuiMultiSelectTempData *ms;
  ImGuiMultiSelectState *pIVar7;
  ImGuiSelectionUserData first_item;
  ImGuiSelectionRequest *__src;
  ImGuiContext *pIVar8;
  bool bVar9;
  byte selected;
  bool bVar10;
  int iVar11;
  ImGuiSelectionRequest *__dest;
  int iVar12;
  ImGuiSelectionUserData first_item_00;
  uint uVar13;
  ImGuiInputSource IVar14;
  char cVar15;
  byte bVar16;
  char cVar17;
  bool bVar18;
  byte bVar19;
  
  pIVar8 = GImGui;
  window = GImGui->CurrentWindow;
  selected = *p_selected;
  bVar10 = *p_pressed;
  ms = GImGui->CurrentMultiSelect;
  if (bVar10 == true) {
    ms->IsFocused = true;
  }
  pIVar7 = ms->Storage;
  if (((pIVar8->LastItemData).StatusFlags & 1) == 0) {
    bVar9 = false;
  }
  else {
    bVar9 = IsItemHovered(0x20);
  }
  if ((bVar9 == false) && (ms->IsFocused == false)) {
    return;
  }
  if (pIVar8->NavId == id) {
    bVar18 = pIVar7->RangeSrcItem == -1;
  }
  else {
    bVar18 = false;
  }
  uVar13 = ms->KeyMods;
  first_item = (pIVar8->NextItemData).SelectionUserData;
  uVar6 = ms->Flags;
  if (ms->IsEndIO == false) {
    if ((ms->IO).Requests.Capacity < 0) {
      __dest = (ImGuiSelectionRequest *)MemAlloc(0);
      __src = (ms->IO).Requests.Data;
      if (__src != (ImGuiSelectionRequest *)0x0) {
        memcpy(__dest,__src,(long)(ms->IO).Requests.Size * 0x18);
        MemFree((ms->IO).Requests.Data);
      }
      (ms->IO).Requests.Data = __dest;
      (ms->IO).Requests.Capacity = 0;
    }
    (ms->IO).Requests.Size = 0;
    ms->IsEndIO = true;
  }
  cVar15 = bVar10;
  if (pIVar8->NavJustMovedToId == id) {
    if ((uVar6 & 8) == 0) {
      cVar15 = '\x01';
      if (((uVar13 & 0x3000) != 0x3000) && (cVar15 = bVar10, (uVar13 & 0x1000) == 0)) {
        cVar15 = '\x01';
        selected = 1;
      }
    }
    else {
      cVar15 = '\x01';
      if ((uVar13 & 0x2000) == 0) {
        cVar15 = bVar10;
      }
      bVar18 = (bool)((uVar13 & 0x3000) == 0 | bVar18);
    }
  }
  if (bVar18) {
    pIVar7->RangeSrcItem = first_item;
    pIVar7->RangeSelected = selected;
  }
  if (((ms->BoxSelectId != 0) && ((GImGui->BoxSelectState).ID == ms->BoxSelectId)) &&
     ((GImGui->BoxSelectState).IsActive == true)) {
    fVar3 = (pIVar8->LastItemData).Rect.Min.y;
    if ((((GImGui->BoxSelectState).BoxSelectRectCurr.Max.y <= fVar3) ||
        (fVar4 = (pIVar8->LastItemData).Rect.Max.y,
        pfVar1 = &(GImGui->BoxSelectState).BoxSelectRectCurr.Min.y,
        fVar4 < *pfVar1 || fVar4 == *pfVar1)) ||
       (fVar4 = (GImGui->BoxSelectState).BoxSelectRectCurr.Max.x,
       pIVar2 = &(pIVar8->LastItemData).Rect, fVar4 < (pIVar2->Min).x || fVar4 == (pIVar2->Min).x))
    {
      bVar10 = false;
    }
    else {
      fVar4 = (pIVar8->LastItemData).Rect.Max.x;
      pIVar2 = &(GImGui->BoxSelectState).BoxSelectRectCurr;
      bVar10 = (pIVar2->Min).x <= fVar4 && fVar4 != (pIVar2->Min).x;
    }
    if ((((GImGui->BoxSelectState).BoxSelectRectPrev.Max.y <= fVar3) ||
        (fVar3 = (pIVar8->LastItemData).Rect.Max.y,
        pfVar1 = &(GImGui->BoxSelectState).BoxSelectRectPrev.Min.y,
        fVar3 < *pfVar1 || fVar3 == *pfVar1)) ||
       (fVar3 = (GImGui->BoxSelectState).BoxSelectRectPrev.Max.x,
       pIVar2 = &(pIVar8->LastItemData).Rect, fVar3 < (pIVar2->Min).x || fVar3 == (pIVar2->Min).x))
    {
      bVar18 = false;
    }
    else {
      fVar3 = (pIVar8->LastItemData).Rect.Max.x;
      pIVar2 = &(GImGui->BoxSelectState).BoxSelectRectPrev;
      bVar18 = (pIVar2->Min).x <= fVar3 && fVar3 != (pIVar2->Min).x;
    }
    if (bVar10 && !bVar18) {
      if (selected == 0) goto LAB_001ba1ae;
    }
    else if (!bVar10 && bVar18) {
LAB_001ba1ae:
      iVar12 = pIVar7->LastSelectionSize;
      if ((iVar12 < 1) && ((GImGui->BoxSelectState).IsStartedSetNavIdOnce == true)) {
        (GImGui->BoxSelectState).IsStartedSetNavIdOnce = false;
        cVar15 = '\x01';
      }
      else {
        selected = selected ^ 1;
        MultiSelectAddSetRange(ms,(bool)selected,1,first_item,first_item);
        iVar12 = pIVar7->LastSelectionSize;
      }
      iVar11 = 0;
      if (0 < iVar12) {
        iVar11 = iVar12;
      }
      pIVar7->LastSelectionSize = iVar11 + 1;
    }
  }
  if (((bVar9 == false) || (bVar10 = IsMouseClicked(1,false), !bVar10)) || ((uVar6 & 8) != 0)) {
LAB_001ba28b:
    if (cVar15 != '\0') {
      bVar16 = (byte)((uVar13 & 0x1000) >> 0xc);
      cVar17 = (char)((uVar13 & 0x2000) >> 0xd);
      goto LAB_001ba2a2;
    }
  }
  else {
    if (pIVar8->ActiveId != id && pIVar8->ActiveId != 0) {
      ClearActiveID();
    }
    SetFocusID(id,window);
    if ((cVar15 != '\0') || (selected != 0)) goto LAB_001ba28b;
    cVar15 = '\x01';
    bVar16 = 0;
    cVar17 = '\0';
LAB_001ba2a2:
    if (pIVar8->NavActivateId == id) {
      if (((pIVar8->NavActivateFlags & 1) != 0) && (selected != 0)) goto LAB_001ba46b;
      IVar14 = ImGuiInputSource_Mouse;
      if (pIVar8->NavJustMovedToId == id || pIVar8->NavActivateId == id) goto LAB_001ba2d9;
    }
    else {
      IVar14 = ImGuiInputSource_Mouse;
      if (pIVar8->NavJustMovedToId == id) {
LAB_001ba2d9:
        IVar14 = pIVar8->NavInputSource;
      }
    }
    if (((((uVar6 & 0xc0) != 0) && (selected == 0)) && ((pIVar8->BoxSelectState).IsActive == false))
       && ((IVar14 == ImGuiInputSource_Mouse && (pIVar8->BoxSelectState).IsStarting == false &&
           ((pIVar8->IO).MouseClickedCount[0] == 1)))) {
      BoxSelectPreStartDrag(ms->BoxSelectId,first_item);
    }
    if ((uVar6 & 0x10) == 0) {
      if ((uVar6 & 1) == 0) {
        if ((IVar14 == ImGuiInputSource_Mouse) || (pIVar8->NavActivateId == id)) {
          if (bVar16 == 0) {
            bVar19 = selected;
            if ((uVar6 & 0x20) != 0) goto joined_r0x001ba35c;
            goto LAB_001ba3a0;
          }
        }
        else if (((IVar14 & ~ImGuiInputSource_Mouse) == ImGuiInputSource_Keyboard) &&
                (bVar19 = bVar16, cVar17 != '\0')) {
joined_r0x001ba35c:
          if (bVar19 == 0) goto LAB_001ba3a0;
        }
      }
      else {
LAB_001ba3a0:
        MultiSelectAddSetAll(ms,false);
      }
    }
    if ((cVar17 == '\0') || ((uVar6 & 1) != 0)) {
      bVar19 = 1;
      if (bVar16 != 0) {
        bVar19 = selected ^ 1;
      }
      if ((uVar6 & 8) != 0) {
        bVar19 = selected ^ 1;
      }
      uVar13 = 1;
      pIVar7->RangeSrcItem = first_item;
      first_item_00 = first_item;
      selected = bVar19;
    }
    else {
      first_item_00 = pIVar7->RangeSrcItem;
      if (pIVar7->RangeSrcItem == -1) {
        pIVar7->RangeSrcItem = first_item;
        first_item_00 = first_item;
      }
      if ((uVar6 & 8) == 0) {
        bVar19 = 1;
        if ((bVar16 != 0) && (IVar5 = pIVar7->RangeSelected, IVar5 != -1)) {
LAB_001ba439:
          bVar19 = IVar5 != '\0';
        }
      }
      else {
        if (ms->IsKeyboardSetRange == true) {
          IVar5 = pIVar7->RangeSelected;
          goto LAB_001ba439;
        }
        bVar19 = selected ^ 1;
      }
      uVar13 = ms->RangeSrcPassedBy - 1 | 1;
    }
    MultiSelectAddSetRange(ms,(bool)bVar19,uVar13,first_item_00,first_item);
  }
LAB_001ba46b:
  if (pIVar7->RangeSrcItem == first_item) {
    pIVar7->RangeSelected = selected;
  }
  if (pIVar8->NavId == id) {
    pIVar7->NavIdItem = first_item;
    pIVar7->NavIdSelected = selected;
  }
  else if (pIVar7->NavIdItem != first_item) goto LAB_001ba492;
  ms->NavIdPassedBy = true;
LAB_001ba492:
  ms->LastSubmittedItem = first_item;
  *p_selected = (bool)selected;
  *p_pressed = (bool)cVar15;
  return;
}

Assistant:

void ImGui::MultiSelectItemFooter(ImGuiID id, bool* p_selected, bool* p_pressed)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    bool selected = *p_selected;
    bool pressed = *p_pressed;
    ImGuiMultiSelectTempData* ms = g.CurrentMultiSelect;
    ImGuiMultiSelectState* storage = ms->Storage;
    if (pressed)
        ms->IsFocused = true;

    bool hovered = false;
    if (g.LastItemData.StatusFlags & ImGuiItemStatusFlags_HoveredRect)
        hovered = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (!ms->IsFocused && !hovered)
        return;

    ImGuiSelectionUserData item_data = g.NextItemData.SelectionUserData;

    ImGuiMultiSelectFlags flags = ms->Flags;
    const bool is_singleselect = (flags & ImGuiMultiSelectFlags_SingleSelect) != 0;
    bool is_ctrl = (ms->KeyMods & ImGuiMod_Ctrl) != 0;
    bool is_shift = (ms->KeyMods & ImGuiMod_Shift) != 0;

    bool apply_to_range_src = false;

    if (g.NavId == id && storage->RangeSrcItem == ImGuiSelectionUserData_Invalid)
        apply_to_range_src = true;
    if (ms->IsEndIO == false)
    {
        ms->IO.Requests.resize(0);
        ms->IsEndIO = true;
    }

    // Auto-select as you navigate a list
    if (g.NavJustMovedToId == id)
    {
        if ((flags & ImGuiMultiSelectFlags_NoAutoSelect) == 0)
        {
            if (is_ctrl && is_shift)
                pressed = true;
            else if (!is_ctrl)
                selected = pressed = true;
        }
        else
        {
            // With NoAutoSelect, using Shift+keyboard performs a write/copy
            if (is_shift)
                pressed = true;
            else if (!is_ctrl)
                apply_to_range_src = true; // Since if (pressed) {} main block is not running we update this
        }
    }

    if (apply_to_range_src)
    {
        storage->RangeSrcItem = item_data;
        storage->RangeSelected = selected; // Will be updated at the end of this function anyway.
    }

    // Box-select toggle handling
    if (ms->BoxSelectId != 0)
        if (ImGuiBoxSelectState* bs = GetBoxSelectState(ms->BoxSelectId))
        {
            const bool rect_overlap_curr = bs->BoxSelectRectCurr.Overlaps(g.LastItemData.Rect);
            const bool rect_overlap_prev = bs->BoxSelectRectPrev.Overlaps(g.LastItemData.Rect);
            if ((rect_overlap_curr && !rect_overlap_prev && !selected) || (rect_overlap_prev && !rect_overlap_curr))
            {
                if (storage->LastSelectionSize <= 0 && bs->IsStartedSetNavIdOnce)
                {
                    pressed = true; // First item act as a pressed: code below will emit selection request and set NavId (whatever we emit here will be overridden anyway)
                    bs->IsStartedSetNavIdOnce = false;
                }
                else
                {
                    selected = !selected;
                    MultiSelectAddSetRange(ms, selected, +1, item_data, item_data);
                }
                storage->LastSelectionSize = ImMax(storage->LastSelectionSize + 1, 1);
            }
        }

    // Right-click handling.
    // FIXME-MULTISELECT: Currently filtered out by ImGuiMultiSelectFlags_NoAutoSelect but maybe should be moved to Selectable(). See https://github.com/ocornut/imgui/pull/5816
    if (hovered && IsMouseClicked(1) && (flags & ImGuiMultiSelectFlags_NoAutoSelect) == 0)
    {
        if (g.ActiveId != 0 && g.ActiveId != id)
            ClearActiveID();
        SetFocusID(id, window);
        if (!pressed && !selected)
        {
            pressed = true;
            is_ctrl = is_shift = false;
        }
    }

    // Unlike Space, Enter doesn't alter selection (but can still return a press) unless current item is not selected.
    // The later, "unless current item is not select", may become optional? It seems like a better default if Enter doesn't necessarily open something
    // (unlike e.g. Windows explorer). For use case where Enter always open something, we might decide to make this optional?
    const bool enter_pressed = pressed && (g.NavActivateId == id) && (g.NavActivateFlags & ImGuiActivateFlags_PreferInput);

    // Alter selection
    if (pressed && (!enter_pressed || !selected))
    {
        // Box-select
        ImGuiInputSource input_source = (g.NavJustMovedToId == id || g.NavActivateId == id) ? g.NavInputSource : ImGuiInputSource_Mouse;
        if (flags & (ImGuiMultiSelectFlags_BoxSelect1d | ImGuiMultiSelectFlags_BoxSelect2d))
            if (selected == false && !g.BoxSelectState.IsActive && !g.BoxSelectState.IsStarting && input_source == ImGuiInputSource_Mouse && g.IO.MouseClickedCount[0] == 1)
                BoxSelectPreStartDrag(ms->BoxSelectId, item_data);

        //----------------------------------------------------------------------------------------
        // ACTION                      | Begin  | Pressed/Activated  | End
        //----------------------------------------------------------------------------------------
        // Keys Navigated:             | Clear  | Src=item, Sel=1               SetRange 1
        // Keys Navigated: Ctrl        | n/a    | n/a
        // Keys Navigated:      Shift  | n/a    | Dst=item, Sel=1,   => Clear + SetRange 1
        // Keys Navigated: Ctrl+Shift  | n/a    | Dst=item, Sel=Src  => Clear + SetRange Src-Dst
        // Keys Activated:             | n/a    | Src=item, Sel=1    => Clear + SetRange 1
        // Keys Activated: Ctrl        | n/a    | Src=item, Sel=!Sel =>         SetSange 1
        // Keys Activated:      Shift  | n/a    | Dst=item, Sel=1    => Clear + SetSange 1
        //----------------------------------------------------------------------------------------
        // Mouse Pressed:              | n/a    | Src=item, Sel=1,   => Clear + SetRange 1
        // Mouse Pressed:  Ctrl        | n/a    | Src=item, Sel=!Sel =>         SetRange 1
        // Mouse Pressed:       Shift  | n/a    | Dst=item, Sel=1,   => Clear + SetRange 1
        // Mouse Pressed:  Ctrl+Shift  | n/a    | Dst=item, Sel=!Sel =>         SetRange Src-Dst
        //----------------------------------------------------------------------------------------

        if ((flags & ImGuiMultiSelectFlags_NoAutoClear) == 0)
        {
            bool request_clear = false;
            if (is_singleselect)
                request_clear = true;
            else if ((input_source == ImGuiInputSource_Mouse || g.NavActivateId == id) && !is_ctrl)
                request_clear = (flags & ImGuiMultiSelectFlags_NoAutoClearOnReselect) ? !selected : true;
            else if ((input_source == ImGuiInputSource_Keyboard || input_source == ImGuiInputSource_Gamepad) && is_shift && !is_ctrl)
                request_clear = true; // With is_shift==false the RequestClear was done in BeginIO, not necessary to do again.
            if (request_clear)
                MultiSelectAddSetAll(ms, false);
        }

        int range_direction;
        bool range_selected;
        if (is_shift && !is_singleselect)
        {
            //IM_ASSERT(storage->HasRangeSrc && storage->HasRangeValue);
            if (storage->RangeSrcItem == ImGuiSelectionUserData_Invalid)
                storage->RangeSrcItem = item_data;
            if ((flags & ImGuiMultiSelectFlags_NoAutoSelect) == 0)
            {
                // Shift+Arrow always select
                // Ctrl+Shift+Arrow copy source selection state (already stored by BeginMultiSelect() in storage->RangeSelected)
                range_selected = (is_ctrl && storage->RangeSelected != -1) ? (storage->RangeSelected != 0) : true;
            }
            else
            {
                // Shift+Arrow copy source selection state
                // Shift+Click always copy from target selection state
                if (ms->IsKeyboardSetRange)
                    range_selected = (storage->RangeSelected != -1) ? (storage->RangeSelected != 0) : true;
                else
                    range_selected = !selected;
            }
            range_direction = ms->RangeSrcPassedBy ? +1 : -1;
        }
        else
        {
            // Ctrl inverts selection, otherwise always select
            if ((flags & ImGuiMultiSelectFlags_NoAutoSelect) == 0)
                selected = is_ctrl ? !selected : true;
            else
                selected = !selected;
            storage->RangeSrcItem = item_data;
            range_selected = selected;
            range_direction = +1;
        }
        MultiSelectAddSetRange(ms, range_selected, range_direction, storage->RangeSrcItem, item_data);
    }

    // Update/store the selection state of the Source item (used by CTRL+SHIFT, when Source is unselected we perform a range unselect)
    if (storage->RangeSrcItem == item_data)
        storage->RangeSelected = selected ? 1 : 0;

    // Update/store the selection state of focused item
    if (g.NavId == id)
    {
        storage->NavIdItem = item_data;
        storage->NavIdSelected = selected ? 1 : 0;
    }
    if (storage->NavIdItem == item_data)
        ms->NavIdPassedBy = true;
    ms->LastSubmittedItem = item_data;

    *p_selected = selected;
    *p_pressed = pressed;
}